

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

int __thiscall
qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::toQASM
          (QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this,
          ostream *stream,int offset)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  pointer pQVar3;
  const_iterator cStack_38;
  int out;
  __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
  local_30;
  const_iterator it;
  int offset_local;
  ostream *stream_local;
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this_local;
  
  it._M_current._4_4_ = offset;
  local_30._M_current =
       (unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
        *)begin(this);
  while( true ) {
    cStack_38 = end(this);
    bVar1 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar1) {
      return 0;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
              ::operator*(&local_30);
    pQVar3 = std::
             unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
             ::operator->(this_00);
    iVar2 = (*pQVar3->_vptr_QObject[0xb])
                      (pQVar3,stream,(ulong)(uint)(this->offset_ + it._M_current._4_4_));
    if (iVar2 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
    ::operator++(&local_30);
  }
  return iVar2;
}

Assistant:

int toQASM( std::ostream& stream , const int offset = 0 ) const override {
        for ( auto it = begin(); it != end(); ++it ) {
          int out = (*it)->toQASM( stream , offset_ + offset ) ;
          if ( out != 0 ) return out ;
        }
        return 0 ;
      }